

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourceCacheGL::DbgVerifyDynamicBufferMasks(ShaderResourceCacheGL *this)

{
  uint uVar1;
  bool bVar2;
  Uint32 UVar3;
  CachedUB *this_00;
  ulong uVar4;
  Char *pCVar5;
  CachedSSBO *this_01;
  char (*in_R8) [33];
  bool local_ad;
  bool local_95;
  undefined1 local_88 [8];
  string msg_1;
  Uint64 SSBOBit;
  CachedSSBO *SSBO;
  Uint32 ssbo;
  undefined1 local_48 [8];
  string msg;
  Uint64 UBBit;
  CachedUB *UB;
  ShaderResourceCacheGL *pSStack_10;
  Uint32 ub;
  ShaderResourceCacheGL *this_local;
  
  pSStack_10 = this;
  for (UB._4_4_ = 0; uVar1 = UB._4_4_, UVar3 = GetUBCount(this), uVar1 < UVar3;
      UB._4_4_ = UB._4_4_ + 1) {
    this_00 = GetConstUB(this,UB._4_4_);
    msg.field_2._8_8_ = 1L << ((byte)UB._4_4_ & 0x3f);
    uVar4 = this->m_DynamicUBOMask & msg.field_2._8_8_;
    bVar2 = CachedUB::IsDynamic(this_00);
    local_95 = false;
    if (bVar2) {
      local_95 = (this->m_DynamicUBOSlotMask & msg.field_2._8_8_) != 0;
    }
    if ((uVar4 != 0) != local_95) {
      FormatString<char[5],unsigned_int,char[32]>
                ((string *)local_48,(Diligent *)"Bit ",(char (*) [5])((long)&UB + 4),
                 (uint *)" in m_DynamicUBOMask is invalid",(char (*) [32])in_R8);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DbgVerifyDynamicBufferMasks",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
                 ,0x15a);
      std::__cxx11::string::~string((string *)local_48);
    }
  }
  for (SSBO._0_4_ = 0; uVar1 = (uint)SSBO, UVar3 = GetSSBOCount(this), uVar1 < UVar3;
      SSBO._0_4_ = (uint)SSBO + 1) {
    this_01 = GetConstSSBO(this,(uint)SSBO);
    msg_1.field_2._8_8_ = 1L << ((byte)(uint)SSBO & 0x3f);
    uVar4 = this->m_DynamicSSBOMask & msg_1.field_2._8_8_;
    bVar2 = CachedSSBO::IsDynamic(this_01);
    local_ad = false;
    if (bVar2) {
      local_ad = (this->m_DynamicSSBOSlotMask & msg_1.field_2._8_8_) != 0;
    }
    if ((uVar4 != 0) != local_ad) {
      FormatString<char[5],unsigned_int,char[33]>
                ((string *)local_88,(Diligent *)"Bit ",(char (*) [5])&SSBO,
                 (uint *)" in m_DynamicSSBOMask is invalid",in_R8);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DbgVerifyDynamicBufferMasks",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
                 ,0x161);
      std::__cxx11::string::~string((string *)local_88);
    }
  }
  return;
}

Assistant:

void ShaderResourceCacheGL::DbgVerifyDynamicBufferMasks() const
{
    for (Uint32 ub = 0; ub < GetUBCount(); ++ub)
    {
        const auto& UB    = GetConstUB(ub);
        const auto  UBBit = Uint64{1} << Uint64{ub};
        VERIFY(((m_DynamicUBOMask & UBBit) != 0) == (UB.IsDynamic() && (m_DynamicUBOSlotMask & UBBit) != 0), "Bit ", ub, " in m_DynamicUBOMask is invalid");
    }

    for (Uint32 ssbo = 0; ssbo < GetSSBOCount(); ++ssbo)
    {
        const auto& SSBO    = GetConstSSBO(ssbo);
        const auto  SSBOBit = Uint64{1} << Uint64{ssbo};
        VERIFY(((m_DynamicSSBOMask & SSBOBit) != 0) == (SSBO.IsDynamic() && (m_DynamicSSBOSlotMask & SSBOBit) != 0), "Bit ", ssbo, " in m_DynamicSSBOMask is invalid");
    }
}